

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight.cpp
# Opt level: O2

int dfsHLD(int a)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  
  sub[a] = 1;
  piVar1 = g[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar2 = 1;
  for (piVar3 = g[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    if (*piVar3 != pred[a][0]) {
      iVar2 = dfsHLD(*piVar3);
      iVar2 = iVar2 + sub[a];
      sub[a] = iVar2;
    }
  }
  return iVar2;
}

Assistant:

int dfsHLD(int a) {
    sub[a] = 1;
    for (auto b : g[a]) {
        if (b == pred[a][0]) continue;
        sub[a] += dfsHLD(b);
    }
    return sub[a];
}